

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::LoadableGetStateBlock_w(ChElementShellANCF_3423 *this)

{
  ChStateDelta *in_RDX;
  int in_ESI;
  
  LoadableGetStateBlock_w
            ((ChElementShellANCF_3423 *)
             ((this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[-7] +
             (long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                    _vptr_ChElementBase),in_ESI,in_RDX);
  return;
}

Assistant:

void ChElementShellANCF_3423::LoadableGetStateBlock_w(int block_offset, ChStateDelta& mD) {
    mD.segment(block_offset + 0, 3) = m_nodes[0]->GetPos_dt().eigen();
    mD.segment(block_offset + 3, 3) = m_nodes[0]->GetD_dt().eigen();
    mD.segment(block_offset + 6, 3) = m_nodes[1]->GetPos_dt().eigen();
    mD.segment(block_offset + 9, 3) = m_nodes[1]->GetD_dt().eigen();
    mD.segment(block_offset + 12, 3) = m_nodes[2]->GetPos_dt().eigen();
    mD.segment(block_offset + 15, 3) = m_nodes[2]->GetD_dt().eigen();
    mD.segment(block_offset + 18, 3) = m_nodes[3]->GetPos_dt().eigen();
    mD.segment(block_offset + 21, 3) = m_nodes[3]->GetD_dt().eigen();
}